

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

void __thiscall llvm::yaml::Input::~Input(Input *this)

{
  (this->super_IO)._vptr_IO = (_func_int **)&PTR__Input_011296d0;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->BitValuesUsed).super__Bvector_base<std::allocator<bool>_>);
  BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::~BumpPtrAllocatorImpl
            (&this->StringAllocator);
  std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>::
  ~unique_ptr(&this->TopNode);
  std::unique_ptr<llvm::yaml::Stream,_std::default_delete<llvm::yaml::Stream>_>::~unique_ptr
            (&this->Strm);
  SourceMgr::~SourceMgr(&this->SrcMgr);
  return;
}

Assistant:

Input::~Input() = default;